

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

void __thiscall QFontDialogPrivate::updateSample(QFontDialogPrivate *this)

{
  bool bVar1;
  int iVar2;
  QFont *in_RDI;
  long in_FS_OFFSET;
  int pSize;
  QFont newFont;
  undefined8 in_stack_ffffffffffffff78;
  QFont *this_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar3;
  int iVar4;
  undefined1 local_48 [48];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QLineEdit::text((QLineEdit *)in_RDI);
  iVar2 = QString::toInt((QString *)in_RDI,
                         (bool *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar4
                        );
  QString::~QString((QString *)0x7940fd);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  iVar4 = iVar2;
  QFontListView::currentText((QFontListView *)CONCAT44(iVar2,in_stack_ffffffffffffff90));
  QFontDatabase::font((QString *)&local_18,(QString *)local_48,(int)in_RDI + 0x3b0);
  QString::~QString((QString *)0x79415c);
  QAbstractButton::isChecked((QAbstractButton *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  QFont::setStrikeOut(SUB81(&local_18,0));
  QAbstractButton::isChecked((QAbstractButton *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  QFont::setUnderline(SUB81(&local_18,0));
  QFontListView::currentText((QFontListView *)CONCAT44(iVar4,in_stack_ffffffffffffff90));
  bVar1 = QString::isEmpty((QString *)0x7941be);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff90);
  QString::~QString((QString *)0x7941cc);
  if ((uVar3 & 0x1000000) != 0) {
    QLineEdit::clear((QLineEdit *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  }
  this_00 = (QFont *)&local_18;
  updateSampleFont((QFontDialogPrivate *)CONCAT44(iVar4,uVar3),in_RDI);
  QFont::~QFont(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontDialogPrivate::updateSample()
{
    // compute new font
    int pSize = sizeEdit->text().toInt();
    QFont newFont(QFontDatabase::font(familyList->currentText(), style, pSize));
    newFont.setStrikeOut(strikeout->isChecked());
    newFont.setUnderline(underline->isChecked());

    if (familyList->currentText().isEmpty())
        sampleEdit->clear();

    updateSampleFont(newFont);
}